

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

int __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanhId>_>
::CompareError(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanhId>_>
               *this,double x0,double y0,double x1,double y1)

{
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar1;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  double ub;
  double err;
  int local_4;
  
  dVar1 = (double)(**(code **)(*in_RDI + 0xe8))(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa);
  if (*(double *)(in_RDI[2] + 0x28) <= dVar1) {
    if (dVar1 <= *(double *)(in_RDI[2] + 0x28)) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int BasicPLApproximator<FuncCon>::CompareError(
    double x0, double y0, double x1, double y1) {
//  auto err = maxErrorAbs(x0, y0, x1, y1);
  auto err = maxErrorRelAbove1(x0, y0, x1, y1);
  auto ub = laPrm_.ubErr;
  if (err<ub)
    return -1;
  if (err>ub)
    return 1;
  return 0;
}